

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupOneOutput(Aig_Man_t *p,int iPoNum,int fAddRegs)

{
  char *pcVar1;
  void *pvVar2;
  int iVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  Aig_Obj_t *p1;
  uint uVar11;
  long lVar12;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDup.c"
                  ,0x485,"Aig_Man_t *Aig_ManDupOneOutput(Aig_Man_t *, int, int)");
  }
  if (p->nObjs[3] - p->nRegs <= iPoNum) {
    __assert_fail("iPoNum < Aig_ManCoNum(p)-Aig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDup.c"
                  ,0x486,"Aig_Man_t *Aig_ManDupOneOutput(Aig_Man_t *, int, int)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar12];
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  if (fAddRegs == 0) {
    p_00->nRegs = 0;
    iVar3 = p->nRegs + p->nTruePis;
  }
  else {
    p_00->nRegs = p->nRegs;
    iVar3 = p->nTruePis;
  }
  p_00->nTruePis = iVar3;
  p_00->nTruePos = 1;
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar12];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_00630752;
        uVar7 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        uVar7 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar6 = Aig_And(p_00,pAVar6,p1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
        pVVar9 = p->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar9->nSize);
  }
  if ((-1 < iPoNum) && (iPoNum < p->vCos->nSize)) {
    pvVar2 = p->vCos->pArray[(uint)iPoNum];
    if (((ulong)pvVar2 & 1) != 0) {
LAB_00630752:
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
    }
    uVar7 = *(ulong *)((long)pvVar2 + 8);
    uVar8 = uVar7 & 0xfffffffffffffffe;
    if (uVar8 == 0) {
      pAVar6 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar8 + 0x28));
    }
    Aig_ObjCreateCo(p_00,pAVar6);
    if (fAddRegs != 0) {
      uVar11 = p->nObjs[3] - p->nRegs;
      pVVar9 = p->vCos;
      if ((int)uVar11 < pVVar9->nSize) {
        uVar7 = (ulong)uVar11;
        do {
          if ((int)uVar11 < 0) goto LAB_00630771;
          if (((ulong)pVVar9->pArray[uVar7] & 1) != 0) goto LAB_00630752;
          uVar8 = *(ulong *)((long)pVVar9->pArray[uVar7] + 8);
          uVar10 = uVar8 & 0xfffffffffffffffe;
          if (uVar10 == 0) {
            pAVar6 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar10 + 0x28));
          }
          Aig_ObjCreateCo(p_00,pAVar6);
          uVar7 = uVar7 + 1;
          pVVar9 = p->vCos;
        } while ((int)uVar7 < pVVar9->nSize);
      }
    }
    Aig_ManCleanup(p_00);
    return p_00;
  }
LAB_00630771:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Aig_ManDupOneOutput( Aig_Man_t * p, int iPoNum, int fAddRegs )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    assert( iPoNum < Aig_ManCoNum(p)-Aig_ManRegNum(p) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = 1;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    pObj = Aig_ManCo( p, iPoNum );
    Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}